

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plaSimple.c
# Opt level: O3

Pla_Man_t * Pla_ManFxPrepare(int nVars)

{
  ulong uVar1;
  ulong uVar2;
  undefined1 auVar3 [16];
  Vec_Bit_t *__ptr;
  Vec_Wrd_t *__ptr_00;
  Pla_Man_t *pPVar4;
  char *pcVar5;
  size_t sVar6;
  int *piVar7;
  word *pwVar8;
  Vec_Int_t *__ptr_01;
  Vec_Int_t *pVVar9;
  ulong uVar10;
  ulong uVar11;
  int iVar12;
  uint uVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  ulong uVar18;
  bool bVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar23 [16];
  char Buffer [1000];
  int local_480;
  int local_47c;
  char local_418 [1000];
  long lVar22;
  
  __ptr = Pla_ManPrimesTable(nVars);
  __ptr_00 = Pla_ManFxMinimize((word *)__ptr->pArray,nVars);
  sprintf(local_418,"primes%02d",(ulong)(uint)nVars);
  local_47c = __ptr_00->nSize;
  uVar18 = (ulong)local_47c;
  pPVar4 = (Pla_Man_t *)calloc(1,0x98);
  pcVar5 = Extra_FileDesignName(local_418);
  pPVar4->pName = pcVar5;
  sVar6 = strlen(local_418);
  pcVar5 = (char *)malloc(sVar6 + 1);
  strcpy(pcVar5,local_418);
  iVar12 = ((nVars >> 5) + 1) - (uint)((nVars & 0x1fU) == 0);
  pPVar4->pSpec = pcVar5;
  pPVar4->nIns = nVars;
  pPVar4->nOuts = 1;
  pPVar4->nInWords = iVar12;
  pPVar4->nOutWords = 1;
  if (0 < (long)uVar18) {
    piVar7 = (int *)malloc(uVar18 * 4);
    (pPVar4->vCubes).pArray = piVar7;
    if (piVar7 == (int *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                    ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    (pPVar4->vCubes).nCap = local_47c;
    auVar3 = _DAT_007ee2e0;
    lVar22 = uVar18 - 1;
    auVar20._8_4_ = (int)lVar22;
    auVar20._0_8_ = lVar22;
    auVar20._12_4_ = (int)((ulong)lVar22 >> 0x20);
    uVar11 = 0;
    auVar20 = auVar20 ^ _DAT_007ee2e0;
    auVar21 = _DAT_007ee2d0;
    do {
      auVar23 = auVar21 ^ auVar3;
      if ((bool)(~(auVar23._4_4_ == auVar20._4_4_ && auVar20._0_4_ < auVar23._0_4_ ||
                  auVar20._4_4_ < auVar23._4_4_) & 1)) {
        piVar7[uVar11] = (int)uVar11;
      }
      if ((auVar23._12_4_ != auVar20._12_4_ || auVar23._8_4_ <= auVar20._8_4_) &&
          auVar23._12_4_ <= auVar20._12_4_) {
        piVar7[uVar11 + 1] = (int)uVar11 + 1;
      }
      uVar11 = uVar11 + 2;
      lVar22 = auVar21._8_8_;
      auVar21._0_8_ = auVar21._0_8_ + 2;
      auVar21._8_8_ = lVar22 + 2;
    } while ((local_47c + 1U & 0xfffffffe) != uVar11);
  }
  (pPVar4->vCubes).nSize = local_47c;
  uVar13 = iVar12 * local_47c;
  if (0 < (int)uVar13) {
    pwVar8 = (word *)malloc((ulong)uVar13 * 8);
    (pPVar4->vInBits).pArray = pwVar8;
    if (pwVar8 == (word *)0x0) goto LAB_0035ee37;
    (pPVar4->vInBits).nCap = uVar13;
    memset(pwVar8,0,(ulong)uVar13 << 3);
  }
  (pPVar4->vInBits).nSize = uVar13;
  if (local_47c < 1) {
    (pPVar4->vOutBits).nSize = local_47c;
    __ptr_01 = (Vec_Int_t *)0x0;
    local_480 = 0;
  }
  else {
    pwVar8 = (word *)malloc(uVar18 * 8);
    (pPVar4->vOutBits).pArray = pwVar8;
    if (pwVar8 == (word *)0x0) {
LAB_0035ee37:
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecWrd.h"
                    ,0x1e4,"void Vec_WrdGrow(Vec_Wrd_t *, int)");
    }
    (pPVar4->vOutBits).nCap = local_47c;
    memset(pwVar8,0,uVar18 * 8);
    (pPVar4->vOutBits).nSize = local_47c;
    __ptr_01 = (Vec_Int_t *)calloc(1,uVar18 << 4);
    (pPVar4->vCubeLits).pArray = __ptr_01;
    (pPVar4->vCubeLits).nCap = local_47c;
    local_480 = local_47c;
  }
  (pPVar4->vCubeLits).nSize = local_47c;
  uVar13 = nVars * 2;
  if (0 < nVars) {
    pVVar9 = (Vec_Int_t *)calloc(1,(ulong)uVar13 << 4);
    (pPVar4->vOccurs).pArray = pVVar9;
    (pPVar4->vOccurs).nCap = uVar13;
  }
  (pPVar4->vOccurs).nSize = uVar13;
  if (0 < local_47c) {
    pwVar8 = __ptr_00->pArray;
    uVar11 = 0;
    do {
      uVar1 = uVar11 + 1;
      if (0 < nVars) {
        uVar2 = pwVar8[uVar11];
        iVar17 = 0;
        iVar12 = nVars;
        do {
          uVar10 = uVar2 >> ((byte)iVar17 & 0x3e);
          if ((uVar10 & 3) != 0) {
            bVar19 = ((uint)uVar10 & 3) == 1;
            if ((long)local_47c <= (long)uVar11) {
              uVar13 = local_47c * 2;
              local_47c = (int)uVar1;
              uVar10 = (ulong)uVar13;
              if ((int)uVar13 <= local_47c) {
                uVar10 = uVar1 & 0xffffffff;
              }
              iVar15 = (int)uVar10;
              if (iVar15 - local_480 != 0 && local_480 <= iVar15) {
                if (__ptr_01 == (Vec_Int_t *)0x0) {
                  __ptr_01 = (Vec_Int_t *)malloc(uVar10 << 4);
                }
                else {
                  __ptr_01 = (Vec_Int_t *)realloc(__ptr_01,uVar10 << 4);
                }
                (pPVar4->vCubeLits).pArray = __ptr_01;
                memset(__ptr_01 + local_480,0,(long)(iVar15 - local_480) << 4);
                (pPVar4->vCubeLits).nCap = iVar15;
                local_480 = iVar15;
              }
              (pPVar4->vCubeLits).nSize = local_47c;
            }
            uVar13 = (uint)bVar19 + iVar17;
            Vec_IntPush(__ptr_01 + uVar11,uVar13);
            iVar15 = (pPVar4->vOccurs).nSize;
            if (iVar15 <= (int)uVar13) {
              iVar16 = (uint)bVar19 + iVar17 + 1;
              iVar14 = iVar15 * 2;
              if (iVar15 * 2 <= iVar16) {
                iVar14 = iVar16;
              }
              iVar15 = (pPVar4->vOccurs).nCap;
              if (iVar15 < iVar14) {
                pVVar9 = (pPVar4->vOccurs).pArray;
                if (pVVar9 == (Vec_Int_t *)0x0) {
                  pVVar9 = (Vec_Int_t *)malloc((long)iVar14 << 4);
                }
                else {
                  pVVar9 = (Vec_Int_t *)realloc(pVVar9,(long)iVar14 << 4);
                }
                (pPVar4->vOccurs).pArray = pVVar9;
                memset(pVVar9 + iVar15,0,(long)(iVar14 - iVar15) << 4);
                (pPVar4->vOccurs).nCap = iVar14;
              }
              (pPVar4->vOccurs).nSize = iVar16;
              iVar15 = iVar16;
            }
            if ((iVar17 < 0) || (iVar15 <= (int)uVar13)) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecWec.h"
                            ,0x9a,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
            }
            Vec_IntPush((pPVar4->vOccurs).pArray + uVar13,(int)uVar11);
          }
          iVar17 = iVar17 + 2;
          iVar12 = iVar12 + -1;
        } while (iVar12 != 0);
      }
      uVar11 = uVar1;
    } while (uVar1 != uVar18);
  }
  if (__ptr->pArray != (int *)0x0) {
    free(__ptr->pArray);
  }
  free(__ptr);
  if (__ptr_00->pArray != (word *)0x0) {
    free(__ptr_00->pArray);
  }
  free(__ptr_00);
  return pPVar4;
}

Assistant:

Pla_Man_t * Pla_ManFxPrepare( int nVars )
{
    Pla_Man_t * p; char Buffer[1000]; 
    Vec_Bit_t * vFunc = Pla_ManPrimesTable( nVars );
    Vec_Wrd_t * vSop = Pla_ManFxMinimize( (word *)Vec_BitArray(vFunc), nVars );
    word Cube, * pCube = &Cube; int i, k, Lit;
    sprintf( Buffer, "primes%02d", nVars );
    p = Pla_ManAlloc( Buffer, nVars, 1, Vec_WrdSize(vSop) );
    Vec_WecInit( &p->vCubeLits, Pla_ManCubeNum(p) );
    Vec_WecInit( &p->vOccurs, 2*Pla_ManInNum(p) );
    Vec_WrdForEachEntry( vSop, Cube, i )
        Pla_CubeForEachLit( nVars, pCube, Lit, k )
            if ( Lit != PLA_LIT_DASH )
            {
                Lit = Abc_Var2Lit( k, Lit == PLA_LIT_ZERO );
                Vec_WecPush( &p->vCubeLits, i, Lit );
                Vec_WecPush( &p->vOccurs, Lit, i );
            }
    Vec_BitFree( vFunc );
    Vec_WrdFree( vSop );
    return p;
}